

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ParameterParameter::Clear(ParameterParameter *this)

{
  bool bVar1;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  ParameterParameter *local_30;
  ParameterParameter *this_local;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_30 = this;
  bVar1 = has_shape(this);
  if (bVar1) {
    local_69 = 0;
    if (this->shape_ == (BlobShape *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x7e13);
      local_69 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: shape_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(local_7d,other);
    }
    if ((local_69 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    BlobShape::Clear(this->shape_);
  }
  this_local = (ParameterParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_20 = &this->_internal_metadata_;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = local_20;
    local_10 = local_20;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_20);
  }
  return;
}

Assistant:

void ParameterParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ParameterParameter)
  if (has_shape()) {
    GOOGLE_DCHECK(shape_ != NULL);
    shape_->::caffe::BlobShape::Clear();
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}